

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_store.cxx
# Opt level: O3

void test_log_store_pack(void)

{
  undefined8 this;
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 *puVar5;
  EVP_PKEY_CTX *ctx;
  fs_log_store *this_00;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  ptr<log_entry> entry1;
  ptr<log_entry> entry2;
  fs_log_store store1;
  fs_log_store store;
  random_device rd;
  _Any_data local_2148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2138;
  undefined8 local_2128;
  ulong local_2120;
  code *local_2118;
  code *local_2110;
  _Any_data local_2108;
  undefined1 local_20f8 [1696];
  undefined1 local_1a58 [16];
  _func_int *local_1a48 [210];
  EVP_PKEY_CTX local_13b8 [5000];
  
  ctx = local_13b8;
  std::random_device::random_device((random_device *)ctx);
  uVar1 = std::random_device::_M_getval();
  uVar3 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  local_2120 = (ulong)(uVar3 + uVar1 + (uint)(uVar1 + uVar3 == 0));
  local_2128 = 0x271000000001;
  local_2110 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:222:34)>
               ::_M_invoke;
  local_2118 = std::
               _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/datatechnology[P]cornerstone/tests/src/test_log_store.cxx:222:34)>
               ::_M_manager;
  cleanup(ctx);
  local_1a58._0_8_ = local_1a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a58,"tmp","");
  cleanup((EVP_PKEY_CTX *)local_1a58);
  if ((_func_int **)local_1a58._0_8_ != local_1a48) {
    operator_delete((void *)local_1a58._0_8_,(ulong)(local_1a48[0] + 1));
  }
  mkdir("tmp",0x1f6);
  local_20f8._0_8_ = local_20f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_20f8,".","");
  cornerstone::fs_log_store::fs_log_store((fs_log_store *)local_1a58,(string *)local_20f8,1000);
  if ((undefined1 *)local_20f8._0_8_ != local_20f8 + 0x10) {
    operator_delete((void *)local_20f8._0_8_,local_20f8._16_8_ + 1);
  }
  local_2148._M_unused._M_object = &local_2138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2148,"tmp","");
  cornerstone::fs_log_store::fs_log_store((fs_log_store *)local_20f8,(string *)&local_2148,1000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2148._M_unused._0_8_ != &local_2138) {
    operator_delete(local_2148._M_unused._M_object,local_2138._M_allocated_capacity + 1);
  }
  if (local_2118 != (code *)0x0) {
    iVar2 = (*local_2110)();
    uVar3 = iVar2 % 1000 + 1000;
    uVar1 = uVar3;
    do {
      rnd_entry((function<int_()> *)&local_2148);
      cornerstone::fs_log_store::append((fs_log_store *)local_1a58,(ptr<log_entry> *)&local_2148);
      rnd_entry((function<int_()> *)&local_2108);
      this = local_2148._8_8_;
      local_2148._M_unused._M_object = local_2108._M_unused._M_object;
      local_2148._8_8_ = local_2108._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
      }
      cornerstone::fs_log_store::append((fs_log_store *)local_20f8,(ptr<log_entry> *)&local_2148);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_);
      }
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
    uVar1 = 0;
    do {
      cornerstone::fs_log_store::pack((fs_log_store *)&local_2148,(ulong)local_1a58,uVar1 + 1);
      cornerstone::fs_log_store::apply_pack
                ((fs_log_store *)local_20f8,(long)(int)(uVar1 + 1),(buffer *)local_2148._8_8_);
      uVar6 = uVar1 + 100;
      uVar1 = uVar6;
      if ((int)uVar3 < (int)uVar6) {
        uVar1 = uVar3;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*local_2148._M_unused._M_function_pointer)();
      }
    } while ((int)uVar6 < (int)uVar3);
    uVar7 = 1;
    if (1 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    uVar4 = 1;
    do {
      cornerstone::fs_log_store::entry_at((fs_log_store *)&local_2148,(ulong)local_1a58);
      puVar5 = local_20f8;
      cornerstone::fs_log_store::entry_at((fs_log_store *)&local_2108,(ulong)local_20f8);
      iVar2 = (int)puVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2108._8_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2148._8_8_);
      }
      bVar8 = uVar4 != uVar7;
      uVar4 = uVar4 + 1;
    } while (bVar8);
    cornerstone::fs_log_store::close((fs_log_store *)local_1a58,iVar2);
    this_00 = (fs_log_store *)local_20f8;
    cornerstone::fs_log_store::close(this_00,iVar2);
    cleanup((EVP_PKEY_CTX *)this_00);
    local_2148._M_unused._M_object = &local_2138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2148,"tmp","");
    cleanup((EVP_PKEY_CTX *)local_2148._M_pod_data);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2148._M_unused._0_8_ != &local_2138) {
      operator_delete(local_2148._M_unused._M_object,local_2138._M_allocated_capacity + 1);
    }
    rmdir("tmp");
    cornerstone::fs_log_store::~fs_log_store((fs_log_store *)local_20f8);
    cornerstone::fs_log_store::~fs_log_store((fs_log_store *)local_1a58);
    if (local_2118 != (code *)0x0) {
      (*local_2118)(&local_2128,&local_2128,3);
    }
    std::random_device::_M_fini();
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void test_log_store_pack()
{
    std::random_device rd;
    std::default_random_engine engine(rd());
    std::uniform_int_distribution<int32> distribution(1, 10000);
    std::function<int32()> rnd = [distribution, engine]() mutable -> int32_t { return distribution(engine); };

    cleanup();
    cleanup("tmp");
    mkdir("tmp", 0766);
    fs_log_store store(".", 1000);
    fs_log_store store1("tmp", 1000);
    int logs_cnt = rnd() % 1000 + 1000;
    for (int i = 0; i < logs_cnt; ++i)
    {
        ptr<log_entry> entry = rnd_entry(rnd);
        store.append(entry);
        entry = rnd_entry(rnd);
        store1.append(entry);
    }

    int logs_copied = 0;
    while (logs_copied < logs_cnt)
    {
        bufptr pack = store.pack(logs_copied + 1, 100);
        store1.apply_pack(logs_copied + 1, *pack);
        logs_copied = std::min(logs_copied + 100, logs_cnt);
    }

    assert(store1.next_slot() == store.next_slot());
    for (int i = 1; i <= logs_cnt; ++i)
    {
        ptr<log_entry> entry1 = store.entry_at((ulong)i);
        ptr<log_entry> entry2 = store1.entry_at((ulong)i);
        assert(entry_equals(*entry1, *entry2));
    }

    store.close();
    store1.close();
    cleanup();
    cleanup("tmp");
    rmdir("tmp");
}